

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splaygetbest(curltime i,Curl_tree *t,Curl_tree **removed)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Curl_tree *pCVar4;
  timediff_t tVar5;
  curltime newer;
  curltime older;
  Curl_tree *x;
  Curl_tree **removed_local;
  Curl_tree *t_local;
  curltime i_local;
  
  if (t == (Curl_tree *)0x0) {
    *removed = (Curl_tree *)0x0;
    i_local.tv_usec = 0;
    i_local._12_4_ = 0;
  }
  else {
    pCVar4 = Curl_splay((curltime)ZEXT816((ulong)0),t);
    uVar1 = (pCVar4->key).tv_sec;
    uVar2 = (pCVar4->key).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(i._0_12_,0);
    newer.tv_usec = SUB124(i._0_12_,8);
    older._12_4_ = 0;
    tVar5 = Curl_timediff_us(newer,older);
    if (tVar5 < 0) {
      *removed = (Curl_tree *)0x0;
      i_local._8_8_ = pCVar4;
    }
    else {
      i_local._8_8_ = pCVar4->samen;
      if ((Curl_tree *)i_local._8_8_ == pCVar4) {
        i_local._8_8_ = pCVar4->larger;
        *removed = pCVar4;
      }
      else {
        (((Curl_tree *)i_local._8_8_)->key).tv_sec = (pCVar4->key).tv_sec;
        uVar3 = *(undefined4 *)&(pCVar4->key).field_0xc;
        (((Curl_tree *)i_local._8_8_)->key).tv_usec = (pCVar4->key).tv_usec;
        *(undefined4 *)&(((Curl_tree *)i_local._8_8_)->key).field_0xc = uVar3;
        ((Curl_tree *)i_local._8_8_)->larger = pCVar4->larger;
        ((Curl_tree *)i_local._8_8_)->smaller = pCVar4->smaller;
        ((Curl_tree *)i_local._8_8_)->samep = pCVar4->samep;
        pCVar4->samep->samen = (Curl_tree *)i_local._8_8_;
        *removed = pCVar4;
      }
    }
  }
  return (Curl_tree *)i_local._8_8_;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct curltime i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  static const struct curltime tv_zero = {0, 0};
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  /* find smallest */
  t = Curl_splay(tv_zero, t);
  DEBUGASSERT(t);
  if(compare(i, t->key) < 0) {
    /* even the smallest is too big */
    *removed = NULL;
    return t;
  }

  /* FIRST! Check if there is a list with identical keys */
  x = t->samen;
  if(x != t) {
    /* there is, pick one from the list */

    /* 'x' is the new root node */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;

    *removed = t;
    return x; /* new root */
  }

  /* we splayed the tree to the smallest element, there is no smaller */
  x = t->larger;
  *removed = t;

  return x;
}